

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Aig_Man_t * Abc_NtkToDarChoices(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  char *pcVar2;
  Aig_Obj_t **ppAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_44;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pPrev;
  Abc_Obj_t *pObj;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk_local;
  
  p = Abc_AigDfs(pNtk,0,0);
  iVar1 = Abc_NtkNodeNum(pNtk);
  pNtk_local = (Abc_Ntk_t *)Aig_ManStart(iVar1 + 100);
  ((Aig_Man_t *)pNtk_local)->nConstrs = pNtk->nConstrs;
  ((Aig_Man_t *)pNtk_local)->nBarBufs = pNtk->nBarBufs;
  pcVar2 = Extra_UtilStrsav(pNtk->pName);
  ((Aig_Man_t *)pNtk_local)->pName = pcVar2;
  pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
  ((Aig_Man_t *)pNtk_local)->pSpec = pcVar2;
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkObjNum(pNtk);
    ppAVar3 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    ((Aig_Man_t *)pNtk_local)->pEquivs = ppAVar3;
    ppAVar3 = ((Aig_Man_t *)pNtk_local)->pEquivs;
    iVar1 = Abc_NtkObjNum(pNtk);
    memset(ppAVar3,0,(long)iVar1 << 3);
  }
  pAVar4 = (Abc_Obj_t *)Aig_ManConst1((Aig_Man_t *)pNtk_local);
  pAVar5 = Abc_AigConst1(pNtk);
  (pAVar5->field_6).pCopy = pAVar4;
  for (local_44 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_44);
    pAVar5 = (Abc_Obj_t *)Aig_ObjCreateCi((Aig_Man_t *)pNtk_local);
    (pAVar4->field_6).pCopy = pAVar5;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pFanin = (Abc_Obj_t *)Vec_PtrEntry(p,local_44);
    pAVar4 = Abc_ObjChild0Copy(pFanin);
    pAVar5 = Abc_ObjChild1Copy(pFanin);
    pAVar4 = (Abc_Obj_t *)Aig_And((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar4,(Aig_Obj_t *)pAVar5);
    (pFanin->field_6).pCopy = pAVar4;
    iVar1 = Abc_AigNodeIsChoice(pFanin);
    if (iVar1 != 0) {
      for (vNodes = (Vec_Ptr_t *)(pFanin->field_5).pData; vNodes != (Vec_Ptr_t *)0x0;
          vNodes = (Vec_Ptr_t *)vNodes[3].pArray) {
        Aig_ObjSetEquiv((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)(pFanin->field_6).pCopy,
                        *(Aig_Obj_t **)(vNodes + 4));
        pFanin = (Abc_Obj_t *)vNodes;
      }
    }
  }
  Vec_PtrFree(p);
  for (local_44 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,local_44);
    pAVar4 = Abc_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar4);
  }
  Aig_ManSetRegNum((Aig_Man_t *)pNtk_local,0);
  iVar1 = Aig_ManCheck((Aig_Man_t *)pNtk_local);
  if (iVar1 == 0) {
    Abc_Print(1,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop((Aig_Man_t *)pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return (Aig_Man_t *)pNtk_local;
}

Assistant:

Aig_Man_t * Abc_NtkToDarChoices( Abc_Ntk_t * pNtk )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pPrev, * pFanin;
    Vec_Ptr_t * vNodes;
    int i;
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        pMan->pEquivs = ABC_ALLOC( Aig_Obj_t *, Abc_NtkObjNum(pNtk) );
        memset( pMan->pEquivs, 0, sizeof(Aig_Obj_t *) * Abc_NtkObjNum(pNtk) );
    }
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // perform the conversion of the internal nodes (assumes DFS ordering)
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
        if ( Abc_AigNodeIsChoice( pObj ) )
        {
            for ( pPrev = pObj, pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
                Aig_ObjSetEquiv( pMan, (Aig_Obj_t *)pPrev->pCopy, (Aig_Obj_t *)pFanin->pCopy );
//            Aig_ManCreateChoice( pIfMan, (Aig_Obj_t *)pNode->pCopy );
        }
    }
    Vec_PtrFree( vNodes );
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, 0 );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}